

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

Zyx_Man_t * Zyx_ManAlloc(Bmc_EsPar_t *pPars,word *pTruth)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Bmc_EsPar_t *pBVar4;
  Zyx_Man_t *p;
  Vec_Int_t *pVVar5;
  Vec_Wrd_t *pVVar6;
  bmcg_sat_solver *s;
  Vec_Bit_t *pVVar7;
  int iVar8;
  int iVar9;
  
  p = (Zyx_Man_t *)calloc(1,0x2278);
  p->pPars = pPars;
  p->pTruth = pTruth;
  iVar2 = pPars->nVars;
  iVar3 = pPars->nNodes;
  iVar9 = iVar3 + iVar2;
  iVar8 = 1 << ((byte)iVar2 - 6 & 0x1f);
  if (iVar2 < 7) {
    iVar8 = 1;
  }
  p->nObjs = iVar9;
  p->nWords = iVar8;
  bVar1 = (byte)pPars->nLutSize;
  p->LutMask = ~(-1 << (bVar1 & 0x1f));
  iVar8 = iVar3 << (bVar1 & 0x1f);
  p->TopoBase = iVar8;
  iVar8 = iVar8 + iVar9 * iVar3;
  p->MintBase = iVar8;
  iVar8 = (iVar9 << ((byte)iVar2 & 0x1f)) + iVar8;
  pVVar5 = Vec_IntAlloc(iVar8);
  pVVar5->nSize = iVar8;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0xff,(long)iVar8 << 2);
  }
  p->vVarValues = pVVar5;
  pVVar5 = Vec_IntAlloc(1 << ((byte)pPars->nVars & 0x1f));
  p->vMidMints = pVVar5;
  pVVar6 = Zyx_ManTruthTables(p,pTruth);
  p->vInfo = pVVar6;
  pBVar4 = p->pPars;
  if (pBVar4->fMajority != 0) {
    pTruth = Zyx_ManTruth(p,p->nObjs);
  }
  pVVar5 = Zyx_ManCreateSymVarPairs(pTruth,pBVar4->nVars);
  p->vPairs = pVVar5;
  s = bmcg_sat_solver_start();
  p->pSat = s;
  if (pPars->fUseIncr == 0) {
    iVar9 = p->nObjs;
  }
  else {
    if (pBVar4->nLutSize == 2) {
      iVar9 = p->nObjs;
    }
    else {
      iVar9 = p->nObjs;
      if (pBVar4->fMajority == 0) {
        if (pBVar4->nLutSize == 3) {
          pVVar7 = Vec_BitStart(iVar9 * iVar9 * iVar9 *
                                (pBVar4->nNodes << ((byte)pBVar4->nVars & 0x1f)));
          p->vUsed3 = pVVar7;
        }
        goto LAB_004a7361;
      }
    }
    pVVar7 = Vec_BitStart(iVar9 * iVar9 * (pBVar4->nNodes << ((byte)pBVar4->nVars & 0x1f)));
    p->vUsed2 = pVVar7;
  }
LAB_004a7361:
  bmcg_sat_solver_set_nvars(s,(iVar9 << ((byte)pBVar4->nVars & 0x1f)) + p->MintBase);
  Zyx_ManSetupVars(p);
  Zyx_ManAddCnfStart(p);
  Zyx_ManPrintVarMap(p,0);
  return p;
}

Assistant:

Zyx_Man_t * Zyx_ManAlloc( Bmc_EsPar_t * pPars, word * pTruth )
{
    Zyx_Man_t * p = ABC_CALLOC( Zyx_Man_t, 1 );
    p->pPars      = pPars;
    p->pTruth     = pTruth;
    p->nObjs      = p->pPars->nVars + p->pPars->nNodes;
    p->nWords     = Abc_TtWordNum(p->pPars->nVars);
    p->LutMask    = (1 << p->pPars->nLutSize) - 1;
    p->TopoBase   = (1 << p->pPars->nLutSize) * p->pPars->nNodes;
    p->MintBase   = p->TopoBase + p->pPars->nNodes * p->nObjs;
    p->vVarValues = Vec_IntStartFull( p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    p->vMidMints  = Vec_IntAlloc( 1 << p->pPars->nVars );
    p->vInfo      = Zyx_ManTruthTables( p, pTruth );
    p->vPairs     = Zyx_ManCreateSymVarPairs( p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : pTruth, p->pPars->nVars );
    p->pSat       = bmcg_sat_solver_start();
    if ( pPars->fUseIncr )
    {
        if ( p->pPars->nLutSize == 2 || p->pPars->fMajority )
            p->vUsed2     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs );
        else if ( p->pPars->nLutSize == 3 )
            p->vUsed3     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs * p->nObjs );
    }
    bmcg_sat_solver_set_nvars( p->pSat, p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    Zyx_ManSetupVars( p );
    Zyx_ManAddCnfStart( p );
    Zyx_ManPrintVarMap( p, 0 );
    return p;
}